

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dac_control.c
# Opt level: O2

void daccontrol_refresh_data(void *info,UINT8 *Data,UINT32 DataLen)

{
  UINT8 *pUVar1;
  UINT32 UVar2;
  
  if (-1 < *(char *)((long)info + 0x7c)) {
    UVar2 = DataLen;
    if (Data == (UINT8 *)0x0) {
      UVar2 = 0;
    }
    pUVar1 = (UINT8 *)0x0;
    if (DataLen != 0) {
      pUVar1 = Data;
    }
    *(UINT32 *)((long)info + 0x60) = UVar2;
    *(UINT8 **)((long)info + 0x68) = pUVar1;
  }
  return;
}

Assistant:

void daccontrol_refresh_data(void* info, UINT8* Data, UINT32 DataLen)
{
	// should be called to fix the data pointer (e.g. after a realloc)
	dac_control* chip = (dac_control*)info;
	
	if (chip->Running & 0x80)
		return;
	
	if (DataLen && Data != NULL)
	{
		chip->DataLen = DataLen;
		chip->Data = Data;
	}
	else
	{
		chip->DataLen = 0x00;
		chip->Data = NULL;
	}
	
	return;
}